

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

int Lf_ManFindCofVar(word *pTruth,int nWords,int nVars)

{
  int iVar1;
  int iVar2;
  int iVar;
  word uTruthCof [128];
  
  iVar = 0;
  iVar2 = 0;
  if (0 < nVars) {
    iVar2 = nVars;
  }
  do {
    if (iVar2 == iVar) {
      return -1;
    }
    Abc_TtCofactor0p(uTruthCof,pTruth,nWords,iVar);
    iVar1 = Abc_TtSupportSize(uTruthCof,nVars);
    if (1 < iVar1) {
      Abc_TtCofactor1p(uTruthCof,pTruth,nWords,iVar);
      iVar1 = Abc_TtSupportSize(uTruthCof,nVars);
      if (1 < iVar1) {
        return iVar;
      }
    }
    iVar = iVar + 1;
  } while( true );
}

Assistant:

static inline int Lf_ManFindCofVar( word * pTruth, int nWords, int nVars )
{
    word uTruthCof[LF_TT_WORDS]; int iVar;
    for ( iVar = 0; iVar < nVars; iVar++ )
    {
        Abc_TtCofactor0p( uTruthCof, pTruth, nWords, iVar );
        if ( Abc_TtSupportSize(uTruthCof, nVars) < 2 )
            continue;
        Abc_TtCofactor1p( uTruthCof, pTruth, nWords, iVar );
        if ( Abc_TtSupportSize(uTruthCof, nVars) < 2 )
            continue;
        return iVar;
    }
    return -1;
}